

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mocks.h
# Opt level: O0

bool __thiscall
agge::tests::mocks::renderer_adapter<unsigned_short>::render_log_entry::operator==
          (render_log_entry *this,render_log_entry *rhs)

{
  bool local_19;
  render_log_entry *rhs_local;
  render_log_entry *this_local;
  
  local_19 = false;
  if (this->x == rhs->x) {
    local_19 = std::operator==(&this->covers,&rhs->covers);
  }
  return local_19;
}

Assistant:

bool operator ==(const render_log_entry &rhs) const
					{	return x == rhs.x && covers == rhs.covers;	}